

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  char *m3;
  char *ret;
  string *name_local;
  cmMakefile *this_local;
  
  this_local = (cmMakefile *)GetDefinition(this,name);
  if (this_local == (cmMakefile *)0x0) {
    m3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("Error required internal CMake variable not set, cmake may be not be built correctly.\n"
               ,"Missing variable is:\n",m3,(char *)0x0);
    this_local = (cmMakefile *)0x9c7e13;
  }
  return (char *)this_local;
}

Assistant:

const char* cmMakefile::GetRequiredDefinition(const std::string& name) const
{
  const char* ret = this->GetDefinition(name);
  if(!ret)
    {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may be not be built correctly.\n",
                         "Missing variable is:\n",
                         name.c_str());
    return "";
    }
  return ret;
}